

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O0

void __thiscall Assimp::ColladaExporter::WriteAnimationsLibrary(ColladaExporter *this)

{
  ostream *poVar1;
  ulong local_18;
  size_t a;
  ColladaExporter *this_local;
  
  if (this->mScene->mNumAnimations != 0) {
    poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar1 = std::operator<<(poVar1,"<library_animations>");
    std::operator<<(poVar1,(string *)&this->endstr);
    PushTag(this);
    for (local_18 = 0; local_18 < this->mScene->mNumAnimations; local_18 = local_18 + 1) {
      WriteAnimationLibrary(this,local_18);
    }
    PopTag(this);
    poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar1 = std::operator<<(poVar1,"</library_animations>");
    std::operator<<(poVar1,(string *)&this->endstr);
  }
  return;
}

Assistant:

void ColladaExporter::WriteAnimationsLibrary()
{
	if ( mScene->mNumAnimations > 0 ) {
		mOutput << startstr << "<library_animations>" << endstr;
		PushTag();
		
		// start recursive write at the root node
		for( size_t a = 0; a < mScene->mNumAnimations; ++a)
			WriteAnimationLibrary( a );

		PopTag();
		mOutput << startstr << "</library_animations>" << endstr;
	}
}